

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.hpp
# Opt level: O1

void __thiscall inja::StatisticsVisitor::visit(StatisticsVisitor *this,IfStatementNode *node)

{
  (*(this->super_NodeVisitor)._vptr_NodeVisitor[8])(this,&node->condition);
  (*(this->super_NodeVisitor)._vptr_NodeVisitor[2])(this,&node->true_statement);
  (*(this->super_NodeVisitor)._vptr_NodeVisitor[2])(this,&node->false_statement);
  return;
}

Assistant:

void visit(const IfStatementNode& node) {
    node.condition.accept(*this);
    node.true_statement.accept(*this);
    node.false_statement.accept(*this);
  }